

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_bounding_box.cpp
# Opt level: O0

bool __thiscall ON_BoundingBox::IsSet(ON_BoundingBox *this)

{
  double *pdVar1;
  bool local_21;
  bool local_11;
  ON_BoundingBox *this_local;
  
  local_11 = false;
  if ((((((-1.23432101234321e+308 < (this->m_min).x) &&
         (local_11 = false,
         (this->m_min).x <= 1.23432101234321e+308 && (this->m_min).x != 1.23432101234321e+308)) &&
        (local_11 = false, -1.23432101234321e+308 < (this->m_max).x)) &&
       ((local_11 = false,
        (this->m_max).x <= 1.23432101234321e+308 && (this->m_max).x != 1.23432101234321e+308 &&
        (local_11 = false, -1.23432101234321e+308 < (this->m_min).y)))) &&
      ((pdVar1 = &(this->m_min).y, local_11 = false,
       *pdVar1 <= 1.23432101234321e+308 && *pdVar1 != 1.23432101234321e+308 &&
       ((local_11 = false, -1.23432101234321e+308 < (this->m_max).y &&
        (pdVar1 = &(this->m_max).y, local_11 = false,
        *pdVar1 <= 1.23432101234321e+308 && *pdVar1 != 1.23432101234321e+308)))))) &&
     ((local_11 = false, -1.23432101234321e+308 < (this->m_min).z &&
      (pdVar1 = &(this->m_min).z, local_11 = false,
      *pdVar1 <= 1.23432101234321e+308 && *pdVar1 != 1.23432101234321e+308)))) {
    local_21 = false;
    if (-1.23432101234321e+308 < (this->m_max).z) {
      pdVar1 = &(this->m_max).z;
      local_21 = *pdVar1 <= 1.23432101234321e+308 && *pdVar1 != 1.23432101234321e+308;
    }
    local_11 = local_21;
  }
  return local_11;
}

Assistant:

bool ON_BoundingBox::IsSet() const
{
	return ( ON_IS_VALID(m_min.x)
          && ON_IS_VALID(m_max.x)
          && ON_IS_VALID(m_min.y)
          && ON_IS_VALID(m_max.y)
          && ON_IS_VALID(m_min.z)
          && ON_IS_VALID(m_max.z)
         );
}